

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.c
# Opt level: O3

void pnga_local_iterator_init(Integer g_a,_iterator_hdl *hdl)

{
  short sVar1;
  uint uVar2;
  global_array_t *pgVar3;
  Integer IVar4;
  Integer IVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  
  pgVar3 = GA;
  lVar6 = g_a + 1000;
  sVar1 = GA[lVar6].ndim;
  lVar9 = (long)sVar1;
  lVar8 = (long)GA[lVar6].p_handle;
  hdl->g_a = g_a;
  hdl->count = 0;
  hdl->oversize = 0;
  switch(pgVar3[lVar6].distr_type) {
  case 1:
    IVar4 = pnga_pgroup_nodeid(lVar8);
    hdl->count = IVar4;
    return;
  case 2:
    IVar4 = pnga_pgroup_nodeid(lVar8);
    pgVar3 = GA;
    if (0 < sVar1) {
      lVar8 = 0;
      do {
        hdl->blk_size[lVar8] = pgVar3[g_a + 1000].block_dims[lVar8];
        hdl->blk_num[lVar8] = pgVar3[g_a + 1000].num_blocks[lVar8];
        hdl->blk_inc[lVar8] = (long)pgVar3[g_a + 1000].nblock[lVar8];
        hdl->blk_dim[lVar8] = pgVar3[g_a + 1000].dims[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar9 != lVar8);
    }
    sVar1 = pgVar3[lVar6].ndim;
    uVar2 = pgVar3[lVar6].nblock[0];
    lVar8 = (long)(int)uVar2;
    lVar6 = IVar4 % lVar8;
    hdl->proc_index[0] = lVar6;
    if (1 < (long)sVar1) {
      lVar9 = (long)sVar1 + -1;
      lVar10 = 0;
      uVar11 = (ulong)uVar2;
      lVar7 = lVar6;
      IVar5 = IVar4;
      do {
        IVar5 = (IVar5 - lVar7) / (long)(int)uVar11;
        uVar11 = (ulong)pgVar3[g_a + 1000].nblock[lVar10 + 1];
        lVar7 = IVar5 % (long)uVar11;
        hdl->proc_index[lVar10 + 1] = lVar7;
        lVar10 = lVar10 + 1;
      } while (lVar9 != lVar10);
      hdl->index[0] = lVar6;
      if (sVar1 < 2) {
        return;
      }
      lVar7 = 0;
      do {
        IVar4 = (IVar4 - lVar6) / (long)(int)lVar8;
        lVar8 = (long)pgVar3[g_a + 1000].nblock[lVar7 + 1];
        lVar6 = IVar4 % lVar8;
        hdl->index[lVar7 + 1] = lVar6;
        lVar7 = lVar7 + 1;
      } while (lVar9 != lVar7);
      return;
    }
    break;
  case 3:
    IVar4 = pnga_pgroup_nodeid(lVar8);
    pgVar3 = GA;
    if (0 < sVar1) {
      lVar8 = 0;
      do {
        hdl->blk_size[lVar8] = pgVar3[g_a + 1000].block_dims[lVar8];
        hdl->blk_num[lVar8] = pgVar3[g_a + 1000].num_blocks[lVar8];
        hdl->blk_inc[lVar8] = (long)pgVar3[g_a + 1000].nblock[lVar8];
        hdl->blk_dim[lVar8] = pgVar3[g_a + 1000].dims[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar9 != lVar8);
    }
    sVar1 = pgVar3[lVar6].ndim;
    uVar2 = pgVar3[lVar6].nblock[0];
    lVar8 = (long)(int)uVar2;
    lVar6 = IVar4 % lVar8;
    hdl->proc_index[0] = lVar6;
    if (1 < (long)sVar1) {
      lVar9 = (long)sVar1 + -1;
      lVar10 = 0;
      uVar11 = (ulong)uVar2;
      lVar7 = lVar6;
      IVar5 = IVar4;
      do {
        IVar5 = (IVar5 - lVar7) / (long)(int)uVar11;
        uVar11 = (ulong)pgVar3[g_a + 1000].nblock[lVar10 + 1];
        lVar7 = IVar5 % (long)uVar11;
        hdl->proc_index[lVar10 + 1] = lVar7;
        lVar10 = lVar10 + 1;
      } while (lVar9 != lVar10);
      hdl->index[0] = lVar6;
      if (sVar1 < 2) {
        return;
      }
      lVar7 = 0;
      do {
        IVar4 = (IVar4 - lVar6) / (long)(int)lVar8;
        lVar8 = (long)pgVar3[g_a + 1000].nblock[lVar7 + 1];
        lVar6 = IVar4 % lVar8;
        hdl->index[lVar7 + 1] = lVar6;
        lVar7 = lVar7 + 1;
      } while (lVar9 != lVar7);
      return;
    }
    break;
  case 4:
    IVar4 = pnga_pgroup_nodeid(lVar8);
    pgVar3 = GA;
    hdl->mapc = GA[lVar6].mapc;
    if (0 < sVar1) {
      lVar8 = 0;
      do {
        hdl->blk_num[lVar8] = pgVar3[g_a + 1000].num_blocks[lVar8];
        hdl->blk_inc[lVar8] = (long)pgVar3[g_a + 1000].nblock[lVar8];
        hdl->blk_dim[lVar8] = pgVar3[g_a + 1000].dims[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar9 != lVar8);
    }
    sVar1 = pgVar3[lVar6].ndim;
    uVar2 = pgVar3[lVar6].nblock[0];
    lVar8 = (long)(int)uVar2;
    lVar6 = IVar4 % lVar8;
    hdl->proc_index[0] = lVar6;
    if (1 < (long)sVar1) {
      lVar9 = (long)sVar1 + -1;
      lVar10 = 0;
      uVar11 = (ulong)uVar2;
      lVar7 = lVar6;
      IVar5 = IVar4;
      do {
        IVar5 = (IVar5 - lVar7) / (long)(int)uVar11;
        uVar11 = (ulong)pgVar3[g_a + 1000].nblock[lVar10 + 1];
        lVar7 = IVar5 % (long)uVar11;
        hdl->proc_index[lVar10 + 1] = lVar7;
        lVar10 = lVar10 + 1;
      } while (lVar9 != lVar10);
      hdl->index[0] = lVar6;
      if (sVar1 < 2) {
        return;
      }
      lVar7 = 0;
      do {
        IVar4 = (IVar4 - lVar6) / (long)(int)lVar8;
        lVar8 = (long)pgVar3[g_a + 1000].nblock[lVar7 + 1];
        lVar6 = IVar4 % lVar8;
        hdl->index[lVar7 + 1] = lVar6;
        lVar7 = lVar7 + 1;
      } while (lVar9 != lVar7);
      return;
    }
    break;
  default:
    goto switchD_0012d4de_default;
  }
  hdl->index[0] = lVar6;
switchD_0012d4de_default:
  return;
}

Assistant:

void pnga_local_iterator_init(Integer g_a, _iterator_hdl *hdl)
{
  Integer handle = GA_OFFSET + g_a;
  Integer ndim = GA[handle].ndim;
  Integer grp = (Integer)GA[handle].p_handle;
  hdl->g_a = g_a;
  hdl->count = 0;
  hdl->oversize = 0;
  /* If standard GA distribution then no additional action needs to be taken */
  if (GA[handle].distr_type == BLOCK_CYCLIC) {
    /* GA uses simple block cyclic data distribution */
    hdl->count = pnga_pgroup_nodeid(grp);
  } else if (GA[handle].distr_type == SCALAPACK) {
    /* GA uses ScaLAPACK block cyclic data distribution */
    int j;
    Integer me = pnga_pgroup_nodeid(grp);
    /* Calculate some properties associated with data distribution */
    for (j=0; j<ndim; j++)  {
      hdl->blk_size[j] = GA[handle].block_dims[j];
      hdl->blk_num[j] = GA[handle].num_blocks[j];
      hdl->blk_inc[j] = GA[handle].nblock[j];
      hdl->blk_dim[j] = GA[handle].dims[j];
    }
    /* Initialize proc_index and index arrays */
    gam_find_proc_indices(handle, me, hdl->proc_index);
    gam_find_proc_indices(handle, me, hdl->index);
  } else if (GA[handle].distr_type == TILED) {
    /* GA uses tiled distribution */
    int j;
    Integer me = pnga_pgroup_nodeid(grp);
    /* Calculate some properties associated with data distribution */
    for (j=0; j<ndim; j++)  {
      hdl->blk_size[j] = GA[handle].block_dims[j];
      hdl->blk_num[j] = GA[handle].num_blocks[j];
      hdl->blk_inc[j] = GA[handle].nblock[j];
      hdl->blk_dim[j] = GA[handle].dims[j];
    }
    /* Initialize proc_index and index arrays */
    gam_find_tile_proc_indices(handle, me, hdl->proc_index);
    gam_find_tile_proc_indices(handle, me, hdl->index);
  } else if (GA[handle].distr_type == TILED_IRREG) {
    /* GA uses irregular tiled distribution */
    int j;
    Integer me = pnga_pgroup_nodeid(grp);
    hdl->mapc = GA[handle].mapc;
    /* Calculate some properties associated with data distribution */
    for (j=0; j<ndim; j++)  {
      hdl->blk_num[j] = GA[handle].num_blocks[j];
      hdl->blk_inc[j] = GA[handle].nblock[j];
      hdl->blk_dim[j] = GA[handle].dims[j];
    }
    /* Initialize proc_index and index arrays */
    gam_find_tile_proc_indices(handle, me, hdl->proc_index);
    gam_find_tile_proc_indices(handle, me, hdl->index);
  }
}